

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O2

bool hasSpecialChars(QString *arg,uchar (*iqm) [16])

{
  bool bVar1;
  int iVar2;
  char16_t *pcVar3;
  
  iVar2 = (int)(arg->d).size;
  pcVar3 = (arg->d).ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 < 0) break;
    bVar1 = isSpecialChar(*(ushort *)((long)pcVar3 + (ulong)(uint)(iVar2 * 2)),iqm);
  } while (!bVar1);
  return -1 < iVar2;
}

Assistant:

inline static
bool hasSpecialChars(const QString &arg, const uchar (&iqm)[16])
{
    for (int x = arg.size() - 1; x >= 0; --x) {
        if (isSpecialChar(arg.unicode()[x].unicode(), iqm))
            return true;
    }
    return false;
}